

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::ExpandRuleVariable
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *variable,
          RuleVariables *replaceValues)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  long lVar4;
  string *source;
  pointer pbVar5;
  char *pcVar6;
  string *psVar7;
  char *pcVar8;
  cmOutputConverter *this_00;
  allocator local_131;
  string targetBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  long local_98;
  string arg1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  
  if ((replaceValues->LinkFlags != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"LINK_FLAGS"), bVar2)) {
    pcVar8 = replaceValues->LinkFlags;
    goto LAB_0033d653;
  }
  if ((replaceValues->Flags != (char *)0x0) && (bVar2 = std::operator==(variable,"FLAGS"), bVar2)) {
    pcVar8 = replaceValues->Flags;
    goto LAB_0033d653;
  }
  if ((replaceValues->Source != (char *)0x0) && (bVar2 = std::operator==(variable,"SOURCE"), bVar2))
  {
    pcVar8 = replaceValues->Source;
    goto LAB_0033d653;
  }
  if ((replaceValues->PreprocessedSource != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"PREPROCESSED_SOURCE"), bVar2)) {
    pcVar8 = replaceValues->PreprocessedSource;
    goto LAB_0033d653;
  }
  if ((replaceValues->AssemblySource != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"ASSEMBLY_SOURCE"), bVar2)) {
    pcVar8 = replaceValues->AssemblySource;
    goto LAB_0033d653;
  }
  if ((replaceValues->Object != (char *)0x0) && (bVar2 = std::operator==(variable,"OBJECT"), bVar2))
  {
    pcVar8 = replaceValues->Object;
    goto LAB_0033d653;
  }
  if ((replaceValues->ObjectDir != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"OBJECT_DIR"), bVar2)) {
    pcVar8 = replaceValues->ObjectDir;
    goto LAB_0033d653;
  }
  if ((replaceValues->ObjectFileDir != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"OBJECT_FILE_DIR"), bVar2)) {
    pcVar8 = replaceValues->ObjectFileDir;
    goto LAB_0033d653;
  }
  if ((replaceValues->Objects != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"OBJECTS"), bVar2)) {
    pcVar8 = replaceValues->Objects;
    goto LAB_0033d653;
  }
  if ((replaceValues->ObjectsQuoted != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"OBJECTS_QUOTED"), bVar2)) {
    pcVar8 = replaceValues->ObjectsQuoted;
    goto LAB_0033d653;
  }
  if ((replaceValues->Defines != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"DEFINES"), bVar2)) {
    pcVar8 = replaceValues->Defines;
    goto LAB_0033d653;
  }
  if ((replaceValues->TargetPDB != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"TARGET_PDB"), bVar2)) {
    pcVar8 = replaceValues->TargetPDB;
    goto LAB_0033d653;
  }
  if ((replaceValues->TargetCompilePDB != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"TARGET_COMPILE_PDB"), bVar2)) {
    pcVar8 = replaceValues->TargetCompilePDB;
    goto LAB_0033d653;
  }
  if ((replaceValues->DependencyFile != (char *)0x0) &&
     (bVar2 = std::operator==(variable,"DEP_FILE"), bVar2)) {
    pcVar8 = replaceValues->DependencyFile;
    goto LAB_0033d653;
  }
  if (replaceValues->Target == (char *)0x0) {
LAB_0033d597:
    bVar2 = std::operator==(variable,"TARGET_SONAME");
    if ((bVar2) ||
       ((bVar2 = std::operator==(variable,"SONAME_FLAG"), bVar2 ||
        (bVar2 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar2)))) {
      if (replaceValues->TargetSOName != (char *)0x0) {
        bVar2 = std::operator==(variable,"TARGET_SONAME");
        if (bVar2) {
          pcVar8 = replaceValues->TargetSOName;
          goto LAB_0033d653;
        }
        bVar2 = std::operator==(variable,"SONAME_FLAG");
        if ((bVar2) && (pcVar8 = replaceValues->SONameFlag, pcVar8 != (char *)0x0))
        goto LAB_0033d653;
        if ((replaceValues->TargetInstallNameDir != (char *)0x0) &&
           (bVar2 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar2)) {
          pcVar8 = replaceValues->TargetInstallNameDir;
          goto LAB_0033d653;
        }
      }
      pcVar8 = "";
    }
    else if ((replaceValues->LinkLibraries == (char *)0x0) ||
            (bVar2 = std::operator==(variable,"LINK_LIBRARIES"), !bVar2)) {
      if ((replaceValues->Language == (char *)0x0) ||
         (bVar2 = std::operator==(variable,"LANGUAGE"), !bVar2)) {
        if (replaceValues->CMTarget != (cmTarget *)0x0) {
          bVar2 = std::operator==(variable,"TARGET_NAME");
          if (bVar2) {
            psVar7 = (string *)&replaceValues->CMTarget->Name;
LAB_0033d4df:
            std::__cxx11::string::string((string *)__return_storage_ptr__,psVar7);
            return __return_storage_ptr__;
          }
          bVar2 = std::operator==(variable,"TARGET_TYPE");
          if (bVar2) {
            pcVar8 = cmTarget::GetTargetTypeName(replaceValues->CMTarget->TargetTypeValue);
            goto LAB_0033d653;
          }
        }
        if ((replaceValues->Output == (char *)0x0) ||
           (bVar2 = std::operator==(variable,"OUTPUT"), !bVar2)) {
          bVar2 = std::operator==(variable,"CMAKE_COMMAND");
          if (bVar2) {
            source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
            cmOutputConverter::Convert
                      (__return_storage_ptr__,&this->super_cmOutputConverter,source,FULL,SHELL);
            return __return_storage_ptr__;
          }
          cmState::GetEnabledLanguages_abi_cxx11_
                    (&enabledLanguages,this->GlobalGenerator->CMakeInstance->State);
          local_98 = 0;
          do {
            pbVar5 = enabledLanguages.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_98 == 0xe) {
              std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)variable);
LAB_0033ddfb:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&enabledLanguages);
              return __return_storage_ptr__;
            }
            while (pbVar5 != enabledLanguages.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish) {
              pcVar8 = (pbVar5->_M_dataplus)._M_p;
              local_50 = pbVar5;
              std::__cxx11::string::string
                        ((string *)&targetBase,ruleReplaceVars[local_98],(allocator *)&arg1);
              bVar2 = std::operator==(&targetBase,"CMAKE_${LANG}_COMPILER");
              if (bVar2) {
                std::operator+(&arg1,&targetBase,"_ARG1");
                cmsys::SystemTools::ReplaceString(&arg1,"${LANG}",pcVar8);
                local_a0 = cmMakefile::GetDefinition(this->Makefile,&arg1);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string((string *)&local_70,"CMAKE_",&local_131);
                std::operator+(&local_108,&local_70,pcVar8);
                std::operator+(&local_e8,&local_108,"_COMPILER_TARGET");
                local_a8 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_70);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string((string *)&local_70,"CMAKE_",&local_131);
                std::operator+(&local_108,&local_70,pcVar8);
                std::operator+(&local_e8,&local_108,"_COMPILE_OPTIONS_TARGET");
                local_b0 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_70);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string((string *)&local_70,"CMAKE_",&local_131);
                std::operator+(&local_108,&local_70,pcVar8);
                std::operator+(&local_e8,&local_108,"_COMPILER_EXTERNAL_TOOLCHAIN");
                local_b8 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_70);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string((string *)&local_70,"CMAKE_",&local_131);
                std::operator+(&local_108,&local_70,pcVar8);
                std::operator+(&local_e8,&local_108,"_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
                local_c0 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_70);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string
                          ((string *)&local_e8,"CMAKE_SYSROOT",(allocator *)&local_108);
                local_c8 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                pcVar1 = this->Makefile;
                std::__cxx11::string::string((string *)&local_70,"CMAKE_",&local_131);
                std::operator+(&local_108,&local_70,pcVar8);
                std::operator+(&local_e8,&local_108,"_COMPILE_OPTIONS_SYSROOT");
                pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&arg1);
              }
              else {
                local_a0 = (char *)0x0;
                local_a8 = (char *)0x0;
                local_b0 = (char *)0x0;
                local_b8 = (char *)0x0;
                local_c0 = (char *)0x0;
                local_c8 = (char *)0x0;
                pcVar6 = (char *)0x0;
              }
              lVar4 = std::__cxx11::string::find((char *)&targetBase,0x484443);
              if (lVar4 != -1) {
                cmsys::SystemTools::ReplaceString(&targetBase,"${LANG}",pcVar8);
              }
              _Var3 = std::operator==(&targetBase,variable);
              if (_Var3) {
                pcVar8 = cmMakefile::GetSafeDefinition(this->Makefile,variable);
                std::__cxx11::string::string((string *)&arg1,pcVar8,(allocator *)&local_e8);
                lVar4 = std::__cxx11::string::find((char *)variable,0x48c802);
                if (lVar4 == -1) {
                  this_00 = &this->super_cmOutputConverter;
                  cmOutputConverter::ConvertToOutputForExisting
                            (__return_storage_ptr__,this_00,&arg1,START_OUTPUT,SHELL);
                  if (local_a0 != (char *)0x0) {
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                  }
                  if (local_b0 != (char *)0x0 && local_a8 != (char *)0x0) {
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                  }
                  if (local_c0 != (char *)0x0 && local_b8 != (char *)0x0) {
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::string
                              ((string *)&local_108,local_b8,(allocator *)&local_70);
                    cmOutputConverter::EscapeForShell(&local_e8,this_00,&local_108,true,false,false)
                    ;
                    std::__cxx11::string::append((string *)__return_storage_ptr__);
                    std::__cxx11::string::~string((string *)&local_e8);
                    std::__cxx11::string::~string((string *)&local_108);
                  }
                  if (pcVar6 != (char *)0x0 && local_c8 != (char *)0x0) {
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::string
                              ((string *)&local_108,local_c8,(allocator *)&local_70);
                    cmOutputConverter::EscapeForShell(&local_e8,this_00,&local_108,true,false,false)
                    ;
                    std::__cxx11::string::append((string *)__return_storage_ptr__);
                    std::__cxx11::string::~string((string *)&local_e8);
                    std::__cxx11::string::~string((string *)&local_108);
                  }
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)arg1._M_dataplus._M_p == &arg1.field_2) {
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(arg1.field_2._M_allocated_capacity._1_7_,
                                  arg1.field_2._M_local_buf[0]);
                    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = arg1.field_2._8_8_
                    ;
                  }
                  else {
                    (__return_storage_ptr__->_M_dataplus)._M_p = arg1._M_dataplus._M_p;
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(arg1.field_2._M_allocated_capacity._1_7_,
                                  arg1.field_2._M_local_buf[0]);
                  }
                  __return_storage_ptr__->_M_string_length = arg1._M_string_length;
                  arg1._M_string_length = 0;
                  arg1.field_2._M_local_buf[0] = '\0';
                  arg1._M_dataplus._M_p = (pointer)&arg1.field_2;
                }
                std::__cxx11::string::~string((string *)&arg1);
                std::__cxx11::string::~string((string *)&targetBase);
                goto LAB_0033ddfb;
              }
              std::__cxx11::string::~string((string *)&targetBase);
              pbVar5 = local_50 + 1;
            }
            local_98 = local_98 + 1;
          } while( true );
        }
        pcVar8 = replaceValues->Output;
      }
      else {
        pcVar8 = replaceValues->Language;
      }
    }
    else {
      pcVar8 = replaceValues->LinkLibraries;
    }
  }
  else {
    bVar2 = std::operator==(variable,"TARGET_QUOTED");
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&targetBase);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,'\"');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==(variable,"TARGET_UNQUOTED");
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&targetBase);
      if (__return_storage_ptr__->_M_string_length < 3) {
        return __return_storage_ptr__;
      }
      pcVar8 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (*pcVar8 != '\"') {
        return __return_storage_ptr__;
      }
      if (pcVar8[__return_storage_ptr__->_M_string_length - 1] != '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&targetBase,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&targetBase);
LAB_0033d465:
      std::__cxx11::string::~string((string *)&targetBase);
      return __return_storage_ptr__;
    }
    if ((replaceValues->LanguageCompileFlags != (char *)0x0) &&
       (bVar2 = std::operator==(variable,"LANGUAGE_COMPILE_FLAGS"), bVar2)) {
      pcVar8 = replaceValues->LanguageCompileFlags;
      goto LAB_0033d653;
    }
    if ((replaceValues->Target != (char *)0x0) &&
       (bVar2 = std::operator==(variable,"TARGET"), bVar2)) {
      pcVar8 = replaceValues->Target;
      goto LAB_0033d653;
    }
    bVar2 = std::operator==(variable,"TARGET_IMPLIB");
    if (bVar2) {
      psVar7 = (string *)&this->TargetImplib;
      goto LAB_0033d4df;
    }
    bVar2 = std::operator==(variable,"TARGET_VERSION_MAJOR");
    if (bVar2) {
      pcVar8 = replaceValues->TargetVersionMajor;
    }
    else {
      bVar2 = std::operator==(variable,"TARGET_VERSION_MINOR");
      if (!bVar2) {
        if ((replaceValues->Target != (char *)0x0) &&
           (bVar2 = std::operator==(variable,"TARGET_BASE"), bVar2)) {
          std::__cxx11::string::string
                    ((string *)&targetBase,replaceValues->Target,(allocator *)&arg1);
          lVar4 = std::__cxx11::string::rfind((char *)&targetBase,0x46a2b5);
          if (lVar4 == -1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetBase._M_dataplus._M_p == &targetBase.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                            targetBase.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = targetBase.field_2._8_8_
              ;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = targetBase._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                            targetBase.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = targetBase._M_string_length;
            targetBase._M_string_length = 0;
            targetBase.field_2._M_local_buf[0] = '\0';
            targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
          }
          else {
            std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&targetBase);
          }
          goto LAB_0033d465;
        }
        goto LAB_0033d597;
      }
      pcVar8 = replaceValues->TargetVersionMinor;
    }
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "0";
    }
  }
LAB_0033d653:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar8,(allocator *)&targetBase);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ExpandRuleVariable(std::string const& variable,
                                     const RuleVariables& replaceValues)
{
  if(replaceValues.LinkFlags)
    {
    if(variable == "LINK_FLAGS")
      {
      return replaceValues.LinkFlags;
      }
    }
  if(replaceValues.Flags)
    {
    if(variable == "FLAGS")
      {
      return replaceValues.Flags;
      }
    }

  if(replaceValues.Source)
    {
    if(variable == "SOURCE")
      {
      return replaceValues.Source;
      }
    }
  if(replaceValues.PreprocessedSource)
    {
    if(variable == "PREPROCESSED_SOURCE")
      {
      return replaceValues.PreprocessedSource;
      }
    }
  if(replaceValues.AssemblySource)
    {
    if(variable == "ASSEMBLY_SOURCE")
      {
      return replaceValues.AssemblySource;
      }
    }
  if(replaceValues.Object)
    {
    if(variable == "OBJECT")
      {
      return replaceValues.Object;
      }
    }
  if(replaceValues.ObjectDir)
    {
    if(variable == "OBJECT_DIR")
      {
      return replaceValues.ObjectDir;
      }
    }
  if(replaceValues.ObjectFileDir)
    {
    if(variable == "OBJECT_FILE_DIR")
      {
      return replaceValues.ObjectFileDir;
      }
    }
  if(replaceValues.Objects)
    {
    if(variable == "OBJECTS")
      {
      return replaceValues.Objects;
      }
    }
  if(replaceValues.ObjectsQuoted)
    {
    if(variable == "OBJECTS_QUOTED")
      {
      return replaceValues.ObjectsQuoted;
      }
    }
  if(replaceValues.Defines && variable == "DEFINES")
    {
    return replaceValues.Defines;
    }
  if(replaceValues.TargetPDB )
    {
    if(variable == "TARGET_PDB")
      {
      return replaceValues.TargetPDB;
      }
    }
  if(replaceValues.TargetCompilePDB)
    {
    if(variable == "TARGET_COMPILE_PDB")
      {
      return replaceValues.TargetCompilePDB;
      }
    }
  if(replaceValues.DependencyFile )
    {
    if(variable == "DEP_FILE")
      {
      return replaceValues.DependencyFile;
      }
    }

  if(replaceValues.Target)
    {
    if(variable == "TARGET_QUOTED")
      {
      std::string targetQuoted = replaceValues.Target;
      if(!targetQuoted.empty() && targetQuoted[0] != '\"')
        {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
        }
      return targetQuoted;
      }
    if(variable == "TARGET_UNQUOTED")
      {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if(sz > 2 && unquoted[0] == '\"' && unquoted[sz-1] == '\"')
        {
        unquoted = unquoted.substr(1, sz-2);
        }
      return unquoted;
      }
    if(replaceValues.LanguageCompileFlags)
      {
      if(variable == "LANGUAGE_COMPILE_FLAGS")
        {
        return replaceValues.LanguageCompileFlags;
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET")
        {
        return replaceValues.Target;
        }
      }
    if(variable == "TARGET_IMPLIB")
      {
      return this->TargetImplib;
      }
    if(variable == "TARGET_VERSION_MAJOR")
      {
      if(replaceValues.TargetVersionMajor)
        {
        return replaceValues.TargetVersionMajor;
        }
      else
        {
        return "0";
        }
      }
    if(variable == "TARGET_VERSION_MINOR")
      {
      if(replaceValues.TargetVersionMinor)
        {
        return replaceValues.TargetVersionMinor;
        }
      else
        {
        return "0";
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET_BASE")
        {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind(".");
        if(pos != targetBase.npos)
          {
        return targetBase.substr(0, pos);
          }
        else
          {
          return targetBase;
          }
        }
      }
    }
  if(variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
     variable == "TARGET_INSTALLNAME_DIR")
    {
    // All these variables depend on TargetSOName
    if(replaceValues.TargetSOName)
      {
      if(variable == "TARGET_SONAME")
        {
        return replaceValues.TargetSOName;
        }
      if(variable == "SONAME_FLAG" && replaceValues.SONameFlag)
        {
        return replaceValues.SONameFlag;
        }
      if(replaceValues.TargetInstallNameDir &&
         variable == "TARGET_INSTALLNAME_DIR")
        {
        return replaceValues.TargetInstallNameDir;
        }
      }
    return "";
    }
  if(replaceValues.LinkLibraries)
    {
    if(variable == "LINK_LIBRARIES")
      {
      return replaceValues.LinkLibraries;
      }
    }
  if(replaceValues.Language)
    {
    if(variable == "LANGUAGE")
      {
      return replaceValues.Language;
      }
    }
  if(replaceValues.CMTarget)
    {
    if(variable == "TARGET_NAME")
      {
      return replaceValues.CMTarget->GetName();
      }
    if(variable == "TARGET_TYPE")
      {
      return cmTarget::GetTargetTypeName(replaceValues.CMTarget->GetType());
      }
    }
  if(replaceValues.Output)
    {
    if(variable == "OUTPUT")
      {
      return replaceValues.Output;
      }
    }
  if(variable == "CMAKE_COMMAND")
    {
    return this->Convert(cmSystemTools::GetCMakeCommand(), FULL, SHELL);
    }
  std::vector<std::string> enabledLanguages =
      this->GetState()->GetEnabledLanguages();
  // loop over language specific replace variables
  int pos = 0;
  while(ruleReplaceVars[pos])
    {
    for(std::vector<std::string>::iterator i = enabledLanguages.begin();
        i != enabledLanguages.end(); ++i)
      {
      const char* lang = i->c_str();
      std::string actualReplace = ruleReplaceVars[pos];
      // If this is the compiler then look for the extra variable
      // _COMPILER_ARG1 which must be the first argument to the compiler
      const char* compilerArg1 = 0;
      const char* compilerTarget = 0;
      const char* compilerOptionTarget = 0;
      const char* compilerExternalToolchain = 0;
      const char* compilerOptionExternalToolchain = 0;
      const char* compilerSysroot = 0;
      const char* compilerOptionSysroot = 0;
      if(actualReplace == "CMAKE_${LANG}_COMPILER")
        {
        std::string arg1 = actualReplace + "_ARG1";
        cmSystemTools::ReplaceString(arg1, "${LANG}", lang);
        compilerArg1 = this->Makefile->GetDefinition(arg1);
        compilerTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang + "_COMPILER_TARGET");
        compilerOptionTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                          "_COMPILE_OPTIONS_TARGET");
        compilerExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                    "_COMPILER_EXTERNAL_TOOLCHAIN");
        compilerOptionExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
        compilerSysroot
              = this->Makefile->GetDefinition("CMAKE_SYSROOT");
        compilerOptionSysroot
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_SYSROOT");
        }
      if(actualReplace.find("${LANG}") != actualReplace.npos)
        {
        cmSystemTools::ReplaceString(actualReplace, "${LANG}", lang);
        }
      if(actualReplace == variable)
        {
        std::string replace =
          this->Makefile->GetSafeDefinition(variable);
        // if the variable is not a FLAG then treat it like a path
        if(variable.find("_FLAG") == variable.npos)
          {
          std::string ret = this->ConvertToOutputForExisting(replace);
          // if there is a required first argument to the compiler add it
          // to the compiler string
          if(compilerArg1)
            {
            ret += " ";
            ret += compilerArg1;
            }
          if (compilerTarget && compilerOptionTarget)
            {
            ret += " ";
            ret += compilerOptionTarget;
            ret += compilerTarget;
            }
          if (compilerExternalToolchain && compilerOptionExternalToolchain)
            {
            ret += " ";
            ret += compilerOptionExternalToolchain;
            ret += this->EscapeForShell(compilerExternalToolchain, true);
            }
          if (compilerSysroot && compilerOptionSysroot)
            {
            ret += " ";
            ret += compilerOptionSysroot;
            ret += this->EscapeForShell(compilerSysroot, true);
            }
          return ret;
          }
        return replace;
        }
      }
    pos++;
    }
  return variable;
}